

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::
     call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
               (QPromise<void> *promise,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  QPromiseReject<void> *this;
  QPromiseResolve<void> *fulfilled;
  bool bVar1;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseError *error;
  QPromiseReject<void> local_50;
  QPromise<void> local_48;
  anon_class_24_2_d74e9aa7 local_38;
  QPromiseReject<void> *local_20;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  QPromise<void> *promise_local;
  
  local_20 = reject;
  reject_local = (QPromiseReject<void> *)resolve;
  resolve_local = (QPromiseResolve<void> *)promise;
  bVar1 = QtPromise::QPromiseBase<void>::isFulfilled(&promise->super_QPromiseBase<void>);
  if (bVar1) {
    QtPromise::QPromiseResolve<void>::operator()((QPromiseResolve<void> *)reject_local);
  }
  else {
    bVar1 = QtPromise::QPromiseBase<void>::isRejected((QPromiseBase<void> *)resolve_local);
    fulfilled = resolve_local;
    this = local_20;
    if (bVar1) {
      this_00 = &QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                           ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *)
                            (resolve_local + 1))->super_PromiseDataBase<void,_void_()>;
      error = PromiseDataBase<void,_void_()>::error(this_00);
      QtPromise::QPromiseReject<void>::operator()(this,error);
    }
    else {
      QtPromise::QPromiseResolve<void>::QPromiseResolve
                ((QPromiseResolve<void> *)&local_38,(QPromiseResolve<void> *)reject_local);
      QtPromise::QPromiseReject<void>::QPromiseReject(&local_50,local_20);
      QtPromise::QPromise<void>::QPromise(&local_48,(QPromise<void> *)resolve_local);
      QtPromise::QPromiseBase<void>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_2_>
                (&local_38.promise.super_QPromiseBase<void>,(anon_class_8_1_c4c2b4cc *)fulfilled,
                 &local_38);
      QtPromise::QPromise<void>::~QPromise(&local_38.promise);
      call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_50);
      call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_38);
    }
  }
  return;
}

Assistant:

static void call(const TPromise& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve();
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve();
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }